

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

bool __thiscall google::protobuf::FieldDescriptor::has_presence(FieldDescriptor *this)

{
  bool bVar1;
  CppType CVar2;
  FeatureSet_FieldPresence FVar3;
  OneofDescriptor *pOVar4;
  FeatureSet *this_00;
  undefined1 local_21;
  FieldDescriptor *this_local;
  
  bVar1 = is_repeated(this);
  if (bVar1) {
    this_local._7_1_ = false;
  }
  else {
    CVar2 = cpp_type(this);
    local_21 = true;
    if (CVar2 != CPPTYPE_MESSAGE) {
      bVar1 = is_extension(this);
      local_21 = true;
      if (!bVar1) {
        pOVar4 = containing_oneof(this);
        local_21 = true;
        if (pOVar4 == (OneofDescriptor *)0x0) {
          this_00 = features(this);
          FVar3 = FeatureSet::field_presence(this_00);
          local_21 = FVar3 != FeatureSet_FieldPresence_IMPLICIT;
        }
      }
    }
    this_local._7_1_ = local_21;
  }
  return this_local._7_1_;
}

Assistant:

bool FieldDescriptor::has_presence() const {
  if (is_repeated()) return false;
  return cpp_type() == CPPTYPE_MESSAGE || is_extension() ||
         containing_oneof() ||
         features().field_presence() != FeatureSet::IMPLICIT;
}